

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

SymmetricMatrix * __thiscall
sptk::SymmetricMatrix::operator=(SymmetricMatrix *this,SymmetricMatrix *matrix)

{
  reference pvVar1;
  reference ppdVar2;
  SymmetricMatrix *in_RSI;
  SymmetricMatrix *in_RDI;
  vector<double_*,_std::allocator<double_*>_> *unaff_retaddr;
  int j;
  int i;
  vector<double,_std::allocator<double>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  int local_18;
  int local_14;
  SymmetricMatrix *__new_size;
  
  if (in_RDI != in_RSI) {
    in_RDI->num_dimension_ = in_RSI->num_dimension_;
    __new_size = in_RDI;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000080,in_stack_00000078);
    std::vector<double_*,_std::allocator<double_*>_>::resize(unaff_retaddr,(size_type)__new_size);
    local_14 = 0;
    local_18 = 0;
    while (local_14 < in_RDI->num_dimension_) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->data_,(long)local_18);
      ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                          (&in_RDI->index_,(long)local_14);
      *ppdVar2 = pvVar1;
      local_14 = local_14 + 1;
      local_18 = local_14 + local_18;
    }
  }
  return in_RDI;
}

Assistant:

SymmetricMatrix& SymmetricMatrix::operator=(const SymmetricMatrix& matrix) {
  if (this != &matrix) {
    num_dimension_ = matrix.num_dimension_;
    data_ = matrix.data_;
    index_.resize(num_dimension_);

    for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
      index_[i] = &data_[j];
    }
  }
  return *this;
}